

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRead.c
# Opt level: O0

int Cudd_bddRead(FILE *fp,DdManager *dd,DdNode **E,DdNode ***x,DdNode ***y,int *nx,int *ny,int *m,
                int *n,int bx,int sx,int by,int sy)

{
  int iVar1;
  DdNode *pDVar2;
  ulong uVar3;
  void *local_a0;
  DdNode **local_98;
  void *local_90;
  DdNode **ly;
  DdNode **lx;
  DdHalfWord local_78;
  int lny;
  int lnx;
  int nv;
  int i;
  int err;
  int v;
  int u;
  DdNode *minterm1;
  DdNode *w;
  DdNode *zero;
  DdNode *one;
  int *nx_local;
  DdNode ***y_local;
  DdNode ***x_local;
  DdNode **E_local;
  DdManager *dd_local;
  FILE *fp_local;
  
  zero = dd->one;
  w = (DdNode *)((ulong)zero ^ 1);
  one = (DdNode *)nx;
  nx_local = (int *)y;
  y_local = x;
  x_local = (DdNode ***)E;
  E_local = (DdNode **)dd;
  dd_local = (DdManager *)fp;
  iVar1 = __isoc99_fscanf(fp,"%d %d",&err,&i);
  if (iVar1 == -1) {
    fp_local._4_4_ = 0;
  }
  else if (iVar1 == 2) {
    *m = err;
    ly = *y_local;
    local_78 = 0;
    for (err = err + -1; 0 < err; err = err >> 1) {
      local_78 = local_78 + 1;
    }
    if ((int)one->index < (int)local_78) {
      if (*y_local == (DdNode **)0x0) {
        local_98 = (DdNode **)malloc((long)(int)local_78 << 3);
      }
      else {
        local_98 = (DdNode **)realloc(*y_local,(long)(int)local_78 << 3);
      }
      ly = local_98;
      *y_local = local_98;
      if (local_98 == (DdNode **)0x0) {
        *(undefined4 *)(E_local + 0x4e) = 1;
        return 0;
      }
    }
    *n = i;
    local_90 = *(void **)nx_local;
    lx._4_4_ = 0;
    for (i = i + -1; 0 < i; i = i >> 1) {
      lx._4_4_ = lx._4_4_ + 1;
    }
    if (*ny < lx._4_4_) {
      if (*(long *)nx_local == 0) {
        local_a0 = malloc((long)lx._4_4_ << 3);
      }
      else {
        local_a0 = realloc(*(void **)nx_local,(long)lx._4_4_ << 3);
      }
      local_90 = local_a0;
      *(void **)nx_local = local_a0;
      if (local_a0 == (void *)0x0) {
        *(undefined4 *)(E_local + 0x4e) = 1;
        return 0;
      }
    }
    lny = bx + one->index * sx;
    for (lnx = one->index; lnx < (int)local_78; lnx = lnx + 1) {
      do {
        *(undefined4 *)(E_local + 0x38) = 0;
        pDVar2 = cuddUniqueInter((DdManager *)E_local,lny,zero,w);
        ly[lnx] = pDVar2;
      } while (*(int *)(E_local + 0x38) == 1);
      if (ly[lnx] == (DdNode *)0x0) {
        return 0;
      }
      *(int *)(((ulong)ly[lnx] & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)ly[lnx] & 0xfffffffffffffffe) + 4) + 1;
      lny = sx + lny;
    }
    lny = by + *ny * sy;
    for (lnx = *ny; lnx < lx._4_4_; lnx = lnx + 1) {
      do {
        *(undefined4 *)(E_local + 0x38) = 0;
        pDVar2 = cuddUniqueInter((DdManager *)E_local,lny,zero,w);
        *(DdNode **)((long)local_90 + (long)lnx * 8) = pDVar2;
      } while (*(int *)(E_local + 0x38) == 1);
      if (*(long *)((long)local_90 + (long)lnx * 8) == 0) {
        return 0;
      }
      uVar3 = *(ulong *)((long)local_90 + (long)lnx * 8) & 0xfffffffffffffffe;
      *(int *)(uVar3 + 4) = *(int *)(uVar3 + 4) + 1;
      lny = sy + lny;
    }
    one->index = local_78;
    *ny = lx._4_4_;
    *x_local = (DdNode **)w;
    *(int *)(((ulong)*x_local & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)*x_local & 0xfffffffffffffffe) + 4) + 1;
    while ((iVar1 = feof((FILE *)dd_local), iVar1 == 0 &&
           (iVar1 = __isoc99_fscanf(dd_local,"%d %d",&err,&i), iVar1 != -1))) {
      if (iVar1 != 2) {
        return 0;
      }
      if ((((*m <= err) || (*n <= i)) || (err < 0)) || (i < 0)) {
        return 0;
      }
      _v = zero;
      *(int *)(((ulong)zero & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)zero & 0xfffffffffffffffe) + 4) + 1;
      lnx = local_78;
      while (lnx = lnx - 1, iVar1 = lx._4_4_, -1 < lnx) {
        if ((err & 1U) == 0) {
          minterm1 = Cudd_bddAnd((DdManager *)E_local,_v,(DdNode *)((ulong)ly[lnx] ^ 1));
        }
        else {
          minterm1 = Cudd_bddAnd((DdManager *)E_local,_v,ly[lnx]);
        }
        if (minterm1 == (DdNode *)0x0) {
          Cudd_RecursiveDeref((DdManager *)E_local,_v);
          return 0;
        }
        *(int *)(((ulong)minterm1 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)minterm1 & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref((DdManager *)E_local,_v);
        _v = minterm1;
        err = err >> 1;
      }
      while (lnx = iVar1 + -1, -1 < lnx) {
        if ((i & 1U) == 0) {
          minterm1 = Cudd_bddAnd((DdManager *)E_local,_v,
                                 (DdNode *)(*(ulong *)((long)local_90 + (long)lnx * 8) ^ 1));
        }
        else {
          minterm1 = Cudd_bddAnd((DdManager *)E_local,_v,
                                 *(DdNode **)((long)local_90 + (long)lnx * 8));
        }
        if (minterm1 == (DdNode *)0x0) {
          Cudd_RecursiveDeref((DdManager *)E_local,_v);
          return 0;
        }
        *(int *)(((ulong)minterm1 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)minterm1 & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref((DdManager *)E_local,_v);
        _v = minterm1;
        i = i >> 1;
        iVar1 = lnx;
      }
      minterm1 = Cudd_bddAnd((DdManager *)E_local,(DdNode *)((ulong)_v ^ 1),
                             (DdNode *)((ulong)*x_local ^ 1));
      if (minterm1 == (DdNode *)0x0) {
        Cudd_RecursiveDeref((DdManager *)E_local,_v);
        return 0;
      }
      minterm1 = (DdNode *)((ulong)minterm1 ^ 1);
      *(int *)(((ulong)minterm1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)minterm1 & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref((DdManager *)E_local,_v);
      Cudd_RecursiveDeref((DdManager *)E_local,(DdNode *)*x_local);
      *x_local = (DdNode **)minterm1;
    }
    fp_local._4_4_ = 1;
  }
  else {
    fp_local._4_4_ = 0;
  }
  return fp_local._4_4_;
}

Assistant:

int
Cudd_bddRead(
  FILE * fp /* input file pointer */,
  DdManager * dd /* DD manager */,
  DdNode ** E /* characteristic function of the graph */,
  DdNode *** x /* array of row variables */,
  DdNode *** y /* array of column variables */,
  int * nx /* number or row variables */,
  int * ny /* number or column variables */,
  int * m /* number of rows */,
  int * n /* number of columns */,
  int  bx /* first index of row variables */,
  int  sx /* step of row variables */,
  int  by /* first index of column variables */,
  int  sy /* step of column variables */)
{
    DdNode *one, *zero;
    DdNode *w;
    DdNode *minterm1;
    int u, v, err, i, nv;
    int lnx, lny;
    DdNode **lx, **ly;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    err = fscanf(fp, "%d %d", &u, &v);
    if (err == EOF) {
        return(0);
    } else if (err != 2) {
        return(0);
    }

    *m = u;
    /* Compute the number of x variables. */
    lx = *x;
    u--;        /* row and column numbers start from 0 */
    for (lnx=0; u > 0; lnx++) {
        u >>= 1;
    }
    if (lnx > *nx) {
        *x = lx = ABC_REALLOC(DdNode *, *x, lnx);
        if (lx == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
    }

    *n = v;
    /* Compute the number of y variables. */
    ly = *y;
    v--;        /* row and column numbers start from 0 */
    for (lny=0; v > 0; lny++) {
        v >>= 1;
    }
    if (lny > *ny) {
        *y = ly = ABC_REALLOC(DdNode *, *y, lny);
        if (ly == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
    }

    /* Create all new variables. */
    for (i = *nx, nv = bx + (*nx) * sx; i < lnx; i++, nv += sx) {
        do {
            dd->reordered = 0;
            lx[i] = cuddUniqueInter(dd, nv, one, zero);
        } while (dd->reordered == 1);
        if (lx[i] == NULL) return(0);
        cuddRef(lx[i]);
    }
    for (i = *ny, nv = by + (*ny) * sy; i < lny; i++, nv += sy) {
        do {
            dd->reordered = 0;
            ly[i] = cuddUniqueInter(dd, nv, one, zero);
        } while (dd->reordered == 1);
        if (ly[i] == NULL) return(0);
        cuddRef(ly[i]);
    }
    *nx = lnx;
    *ny = lny;

    *E = zero; /* this call will never cause reordering */
    cuddRef(*E);

    while (! feof(fp)) {
        err = fscanf(fp, "%d %d", &u, &v);
        if (err == EOF) {
            break;
        } else if (err != 2) {
            return(0);
        } else if (u >= *m || v >= *n || u < 0 || v < 0) {
            return(0);
        }
 
        minterm1 = one; cuddRef(minterm1);

        /* Build minterm1 corresponding to this arc. */
        for (i = lnx - 1; i>=0; i--) {
            if (u & 1) {
                w = Cudd_bddAnd(dd, minterm1, lx[i]);
            } else {
                w = Cudd_bddAnd(dd, minterm1, Cudd_Not(lx[i]));
            }
            if (w == NULL) {
                Cudd_RecursiveDeref(dd, minterm1);
                return(0);
            }
            cuddRef(w);
            Cudd_RecursiveDeref(dd,minterm1);
            minterm1 = w;
            u >>= 1;
        }
        for (i = lny - 1; i>=0; i--) {
            if (v & 1) {
                w = Cudd_bddAnd(dd, minterm1, ly[i]);
            } else {
                w = Cudd_bddAnd(dd, minterm1, Cudd_Not(ly[i]));
            }
            if (w == NULL) {
                Cudd_RecursiveDeref(dd, minterm1);
                return(0);
            }
            cuddRef(w);
            Cudd_RecursiveDeref(dd, minterm1);
            minterm1 = w;
            v >>= 1;
        }

        w = Cudd_bddAnd(dd, Cudd_Not(minterm1), Cudd_Not(*E));
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, minterm1);
            return(0);
        }
        w = Cudd_Not(w);
        cuddRef(w);
        Cudd_RecursiveDeref(dd, minterm1);
        Cudd_RecursiveDeref(dd, *E);
        *E = w;
    }
    return(1);

}